

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::SourceLocationTable::Find
          (SourceLocationTable *this,Message *descriptor,ErrorLocation location,int *line,
          int *column)

{
  second_type *psVar1;
  pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>
  pVar2;
  first_type local_50;
  pair<int,_int> *result;
  int *column_local;
  int *line_local;
  Message *pMStack_20;
  ErrorLocation location_local;
  Message *descriptor_local;
  SourceLocationTable *this_local;
  
  result = (pair<int,_int> *)column;
  column_local = line;
  line_local._4_4_ = location;
  pMStack_20 = descriptor;
  descriptor_local = (Message *)this;
  pVar2 = std::
          make_pair<google::protobuf::Message_const*&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation&>
                    (&stack0xffffffffffffffe0,(ErrorLocation *)((long)&line_local + 4));
  local_50.first = pVar2.first;
  local_50.second = pVar2.second;
  psVar1 = FindOrNull<std::map<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>,std::less<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>>
                     (&this->location_map_,&local_50);
  if (psVar1 != (second_type *)0x0) {
    *column_local = psVar1->first;
    result->first = psVar1->second;
  }
  else {
    *column_local = -1;
    result->first = 0;
  }
  return psVar1 != (second_type *)0x0;
}

Assistant:

bool SourceLocationTable::Find(
    const Message* descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location, int* line,
    int* column) const {
  const std::pair<int, int>* result =
      FindOrNull(location_map_, std::make_pair(descriptor, location));
  if (result == NULL) {
    *line = -1;
    *column = 0;
    return false;
  } else {
    *line = result->first;
    *column = result->second;
    return true;
  }
}